

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_4faa5c::ForwardTemplateReference::hasArraySlow
          (ForwardTemplateReference *this,OutputStream *S)

{
  bool bVar1;
  
  if (this->Printing == false) {
    this->Printing = true;
    bVar1 = Node::hasArray(this->Ref,S);
    this->Printing = false;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool hasArraySlow(OutputStream &S) const override {
    if (Printing)
      return false;
    SwapAndRestore<bool> SavePrinting(Printing, true);
    return Ref->hasArray(S);
  }